

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_mdef_gen.c
# Opt level: O2

int32 make_mdef_from_list(char *mdeffile,char **CIlist,int32 nciphones,heapelement_t **CDheap,
                         int32 cdheapsize,char *pgm)

{
  acmod_id_t aVar1;
  acmod_id_t left_context;
  acmod_id_t right_context;
  word_posn_t posn;
  cmd_ln_t *cmdln;
  char **base_str;
  uint32 **state;
  char *pcVar2;
  heapelement_t *heapel;
  acmod_set_t *acmod_set;
  FILE *__stream;
  char *fmt;
  char **attrib;
  long ln;
  ulong uVar3;
  size_t n_elem;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int32 cdheapsize_local;
  char **local_e0;
  char **local_d8;
  char **local_d0;
  ulong local_c8;
  ulong local_c0;
  uint32 *local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  char *local_88;
  char *local_80;
  size_t local_78;
  heapelement_t **CDheap_local;
  char *na_attr [2];
  char *base_attr [2];
  char *filler_attr [2];
  
  uVar6 = (ulong)(uint)cdheapsize;
  filler_attr[0] = "filler";
  filler_attr[1] = (char *)0x0;
  base_attr[0] = "base";
  base_attr[1] = (char *)0x0;
  na_attr[0] = "n/a";
  na_attr[1] = (char *)0x0;
  cdheapsize_local = cdheapsize;
  local_88 = pgm;
  local_80 = mdeffile;
  CDheap_local = CDheap;
  cmdln = cmd_ln_get();
  local_c8 = cmd_ln_int_r(cmdln,"-n_state_pm");
  uVar8 = 0;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0x381,"%d n_base, %d n_tri\n",(ulong)(uint)nciphones,uVar6);
  local_b0 = (ulong)(uint)(cdheapsize + nciphones);
  n_elem = (size_t)(cdheapsize + nciphones);
  base_str = (char **)__ckd_calloc__(n_elem,8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                     ,0x388);
  local_d8 = (char **)__ckd_calloc__(n_elem,8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                     ,0x389);
  local_e0 = (char **)__ckd_calloc__(n_elem,8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                     ,0x38a);
  local_d0 = (char **)__ckd_calloc__(n_elem,8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                     ,0x38b);
  local_b8 = (uint32 *)
             __ckd_calloc__(n_elem,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                            ,0x38d);
  local_78 = n_elem;
  state = (uint32 **)
          __ckd_calloc_2d__(n_elem,(long)(int)local_c8,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                            ,0x38f);
  uVar7 = 0;
  if (0 < nciphones) {
    uVar7 = (ulong)(uint)nciphones;
  }
  uVar3 = 0;
  local_c0 = (ulong)(uint)nciphones;
  local_a8 = uVar6;
  if (0 < cdheapsize) {
    uVar3 = (ulong)(uint)cdheapsize;
  }
  for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
    pcVar2 = strdup(CIlist[uVar8]);
    base_str[uVar8] = pcVar2;
  }
  local_98 = (ulong)((int)local_c8 + 1);
  local_90 = uVar3;
  for (uVar6 = uVar7; uVar8 + uVar3 != uVar6; uVar6 = uVar6 + 1) {
    heapel = yanktop(&CDheap_local,cdheapsize_local,&cdheapsize_local);
    pcVar2 = strdup(heapel->basephone);
    base_str[uVar6] = pcVar2;
    pcVar2 = strdup(heapel->leftcontext);
    local_d8[uVar6] = pcVar2;
    pcVar2 = strdup(heapel->rightcontext);
    local_e0[uVar6] = pcVar2;
    pcVar2 = strdup(heapel->wordposition);
    local_d0[uVar6] = pcVar2;
    free_heapelement(heapel);
  }
  if (cdheapsize_local == 0) {
    local_a0 = (ulong)(uint)((int)local_c8 * (int)local_c0);
    uVar6 = 0;
    uVar8 = 0;
    if (0 < (int)local_c8) {
      uVar8 = local_c8 & 0xffffffff;
    }
    uVar3 = 0;
    if (0 < (int)local_b0) {
      uVar3 = local_b0 & 0xffffffff;
    }
    iVar4 = 0;
    for (; uVar6 != uVar3; uVar6 = uVar6 + 1) {
      for (uVar5 = 0; uVar8 != uVar5; uVar5 = uVar5 + 1) {
        state[uVar6][uVar5] = iVar4 + (int)uVar5;
      }
      iVar4 = iVar4 + (int)uVar5;
    }
    acmod_set = acmod_set_new();
    acmod_set_set_n_ci_hint(acmod_set,(uint32)local_c0);
    acmod_set_set_n_tri_hint(acmod_set,(uint32)local_a8);
    for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      attrib = filler_attr;
      if (*base_str[uVar6] != '+') {
        attrib = base_attr;
      }
      aVar1 = acmod_set_add_ci(acmod_set,base_str[uVar6],attrib);
      local_b8[aVar1] = aVar1;
    }
    for (; pcVar2 = local_80, (long)uVar7 < (long)local_78; uVar7 = uVar7 + 1) {
      aVar1 = acmod_set_name2id(acmod_set,base_str[uVar7]);
      if (aVar1 == 0xffffffff) {
        pcVar2 = base_str[uVar7];
        fmt = "Error in dictionary or phonelist. Bad basephone %s in triphone list!\n";
        ln = 0x3b5;
        goto LAB_0010560f;
      }
      left_context = acmod_set_name2id(acmod_set,local_d8[uVar7]);
      if (left_context == 0xffffffff) {
        pcVar2 = local_d8[uVar7];
        fmt = "Error in dictionary or phonelist. Bad leftphone %s in triphone list!\n";
        ln = 0x3b7;
        goto LAB_0010560f;
      }
      right_context = acmod_set_name2id(acmod_set,local_e0[uVar7]);
      if (right_context == 0xffffffff) {
        pcVar2 = local_e0[uVar7];
        fmt = "Error in dictionary or phonelist. Bad rightphone %s in triphone list!\n";
        ln = 0x3b9;
        goto LAB_0010560f;
      }
      posn = posnstr2wordpos(local_d0[uVar7]);
      acmod_set_add_tri(acmod_set,aVar1,left_context,right_context,posn,na_attr);
      local_b8[uVar7] = aVar1;
    }
    __stream = fopen(local_80,"w");
    if (__stream != (FILE *)0x0) {
      output_model_def((FILE *)__stream,local_88,base_str,local_d8,local_e0,local_d0,local_b8,state,
                       (uint32)local_c0,(uint32)local_a8,(uint32)local_b0,(uint32)local_98,
                       (int)local_c8 * (uint32)local_b0,(uint32)local_a0,(uint32)local_c0);
      fclose(__stream);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
              ,0x3c9,"Wrote mdef file %s\n",pcVar2);
      uVar6 = local_90;
      for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        free(base_str[uVar7]);
        free(local_d8[uVar7]);
        free(local_e0[uVar7]);
        free(local_d0[uVar7]);
      }
      free(base_str);
      free(local_d8);
      free(local_e0);
      free(local_d0);
      ckd_free_2d(state);
      return 0;
    }
    fmt = "Unable to open %s for writing!\n";
    ln = 0x3c2;
LAB_0010560f:
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,ln,fmt,pcVar2);
  }
  else {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x39e,"Error in CD heap! Error in dictionary or phone list!\n");
  }
  exit(1);
}

Assistant:

int32 make_mdef_from_list(const char *mdeffile,
			char **CIlist, 
			int32  nciphones,
			heapelement_t **CDheap,
			int32  cdheapsize,
			char  *pgm)
{
    int32  n_base, n_tri, n_state_pm, n_total;
    int32  n_tied_state_ci, n_tied_state_cd, n_tied_tmat;
    char   **base_str, **left_str, **right_str, **posn_str;
    acmod_id_t base, left, right;
    word_posn_t posn;
    acmod_set_t  *acmod_set;
    int32 i,j,k;
    const char *filler_attr[] = {"filler", NULL};
    const char *base_attr[] = {"base", NULL};
    const char *na_attr[] = {"n/a", NULL};
    uint32 *tmat; 
    uint32 **smap;
    heapelement_t *cdphone;
    FILE  *fp;

    n_state_pm = cmd_ln_int32("-n_state_pm") + 1;
    n_base = nciphones;
    n_tri = cdheapsize;
    E_INFO("%d n_base, %d n_tri\n", n_base, n_tri);

    n_tied_state_ci = n_base * (n_state_pm-1);
    n_tied_state_cd = n_tri * (n_state_pm-1);
    n_tied_tmat = n_base;

    n_total = n_base + n_tri;
    base_str = ckd_calloc(n_total, sizeof(char *));
    left_str = ckd_calloc(n_total, sizeof(char *));
    right_str = ckd_calloc(n_total, sizeof(char *));
    posn_str = ckd_calloc(n_total, sizeof(char *));

    tmat = ckd_calloc(n_total, sizeof(uint32));

    smap = (uint32 **)ckd_calloc_2d(n_total, n_state_pm-1, sizeof(uint32));

    for (i = 0; i < n_base; i++) {
        base_str[i] = strdup(CIlist[i]);
    }

    for (j = 0; j < n_tri; j++,i++) {
        cdphone = yanktop(&CDheap,cdheapsize,&cdheapsize);
	base_str[i] = strdup(cdphone->basephone);
	left_str[i] = strdup(cdphone->leftcontext);
	right_str[i] = strdup(cdphone->rightcontext);
	posn_str[i] = strdup(cdphone->wordposition);
	free_heapelement(cdphone);
    }
    if (cdheapsize != 0) 
        E_FATAL("Error in CD heap! Error in dictionary or phone list!\n");

    for (i = 0, k = 0; i < n_total; i++)
        for (j = 0; j < n_state_pm-1; j++)
            smap[i][j] = k++;

    acmod_set = acmod_set_new();

    acmod_set_set_n_ci_hint(acmod_set, n_base);
    acmod_set_set_n_tri_hint(acmod_set, n_tri);

    for (i = 0; i < n_base; i++) {
        if (base_str[i][0] == '+') {
            base = acmod_set_add_ci(acmod_set, base_str[i], filler_attr);
        }
        else {
            base = acmod_set_add_ci(acmod_set, base_str[i], base_attr);
        }
        tmat[base] = base;
    }

    for (; i < n_total; i++) {
        if ((base = acmod_set_name2id(acmod_set, base_str[i])) == NO_ACMOD)
	    E_FATAL("Error in dictionary or phonelist. Bad basephone %s in triphone list!\n",base_str[i]);
        if ((left = acmod_set_name2id(acmod_set, left_str[i])) == NO_ACMOD)
	    E_FATAL("Error in dictionary or phonelist. Bad leftphone %s in triphone list!\n",left_str[i]);
        if ((right = acmod_set_name2id(acmod_set, right_str[i])) == NO_ACMOD)
	    E_FATAL("Error in dictionary or phonelist. Bad rightphone %s in triphone list!\n",right_str[i]);

	posn = posnstr2wordpos(posn_str[i]);

        acmod_set_add_tri(acmod_set, base, left, right, posn, na_attr);
        tmat[i] = base;
    }

    if ((fp = fopen(mdeffile, "w")) == NULL)
        E_FATAL("Unable to open %s for writing!\n",mdeffile);
    output_model_def(fp,
             pgm,
             base_str, left_str, right_str, posn_str, tmat, smap,
             n_base, n_tri, n_total, n_state_pm,
             n_tied_state_ci+n_tied_state_cd, n_tied_state_ci, n_tied_tmat);
    fclose(fp);
    E_INFO("Wrote mdef file %s\n",mdeffile);

    for (j = 0; j < n_tri; j++,i++) {
	if (base_str[j] != NULL) free(base_str[j]);
	if (left_str[j] != NULL) free(left_str[j]);
	if (right_str[j] != NULL) free(right_str[j]);
	if (posn_str[j] != NULL) free(posn_str[j]);
    }
    free(base_str); free(left_str); free(right_str); free(posn_str);
    ckd_free_2d((void**)smap);

    return 0;
}